

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O3

void anon_unknown.dwarf_34a0d1::waves(Array2D<Imf_3_4::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  char cVar6;
  ushort uVar7;
  float fVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  float fVar13;
  ulong local_78;
  
  if (0 < h) {
    lVar11 = 0;
    local_78 = 0;
    do {
      if (0 < w) {
        dVar2 = (double)(int)local_78;
        uVar12 = 0;
        do {
          lVar10 = pixels->_sizeY;
          dVar3 = (double)(int)uVar12;
          pRVar1 = pixels->_data;
          dVar4 = sin(dVar3 * 0.1 + dVar2 * 0.1);
          dVar5 = sin(dVar3 * -0.1 + dVar2 * 0.2);
          fVar13 = (float)(dVar5 * 0.5 + 0.5 + dVar4 * 0.5 + 0.5);
          fVar8 = ABS(fVar13);
          uVar7 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar9 = (uint)fVar8 & 0x7fffff | 0x800000, cVar6 = (char)((uint)fVar8 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar6 & 0x1f)),
               0x80000000 < uVar9 << (cVar6 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar9 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
            }
          }
          lVar10 = lVar10 * lVar11;
          *(ushort *)((long)&pRVar1[uVar12].r._h + lVar10) = uVar7;
          *(ushort *)((long)&pRVar1[uVar12].g._h + lVar10) = uVar7;
          *(ushort *)((long)&pRVar1[uVar12].b._h + lVar10) = uVar7;
          dVar3 = sin(dVar3 * 1.1 + dVar2 * 0.5);
          fVar13 = (float)(dVar3 * 0.5 + 0.5);
          fVar8 = ABS(fVar13);
          uVar7 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
          if ((uint)fVar8 < 0x38800000) {
            if ((0x33000000 < (uint)fVar8) &&
               (uVar9 = (uint)fVar8 & 0x7fffff | 0x800000, cVar6 = (char)((uint)fVar8 >> 0x17),
               uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar6 & 0x1f)),
               0x80000000 < uVar9 << (cVar6 + 0xa2U & 0x1f))) {
              uVar7 = uVar7 + 1;
            }
          }
          else if ((uint)fVar8 < 0x7f800000) {
            if ((uint)fVar8 < 0x477ff000) {
              uVar7 = (ushort)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar7;
            }
            else {
              uVar7 = uVar7 | 0x7c00;
            }
          }
          else {
            uVar7 = uVar7 | 0x7c00;
            if (fVar8 != INFINITY) {
              uVar9 = (uint)fVar8 >> 0xd & 0x3ff;
              uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
            }
          }
          *(ushort *)((long)&pRVar1[uVar12].a._h + lVar10) = uVar7;
          uVar12 = uVar12 + 1;
        } while ((uint)w != uVar12);
      }
      local_78 = local_78 + 1;
      lVar11 = lVar11 + 8;
    } while (local_78 != (uint)h);
  }
  return;
}

Assistant:

void
waves (Array2D<Rgba>& pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];

            p.r = (0.5 + 0.5 * sin (0.1 * x + 0.1 * y)) +
                  (0.5 + 0.5 * sin (-0.1 * x + 0.2 * y));

            p.g = p.r;
            p.b = p.r;

            p.a = (0.5 + 0.5 * sin (1.1 * x + 0.5 * y));
        }
    }
}